

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int walFindFrame(Wal *pWal,Pgno pgno,u32 *piRead)

{
  uint uVar1;
  ushort uVar2;
  uint uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  char cVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iHash;
  ulong uVar11;
  int iVar12;
  uint uVar13;
  long in_FS_OFFSET;
  int local_8c;
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = (pWal->hdr).mxFrame;
  uVar9 = 0;
  if ((uVar3 != 0) && ((pWal->readLock != 0 || (pWal->bShmUnreliable != '\0')))) {
    uVar11 = (ulong)(uVar3 + 0x1000) + 0xffffffff021 >> 0xc;
    iVar12 = (int)((ulong)(pWal->minFrame + 0x1000) + 0xffffffff021 >> 0xc);
    if (iVar12 <= (int)uVar11) {
      uVar9 = 0;
      do {
        local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        iHash = (int)uVar11;
        iVar8 = walHashGet(pWal,iHash,(WalHashLoc *)local_58);
        uVar5 = local_58._8_8_;
        uVar4 = local_58._0_8_;
        if (iVar8 == 0) {
          uVar6 = local_58._16_4_;
          iVar10 = 0x2001;
          uVar13 = pgno * 0x17f & 0x1fff;
          do {
            uVar2 = *(ushort *)(uVar4 + (ulong)uVar13 * 2);
            if (uVar2 == 0) {
              cVar7 = (uVar9 != 0) * '\x02';
              goto LAB_00138246;
            }
            uVar1 = (uint)uVar2 + uVar6;
            if (((uVar1 <= uVar3) && (pWal->minFrame <= uVar1)) &&
               (*(Pgno *)(uVar5 + ((ulong)(uint)uVar2 - 1) * 4) == pgno)) {
              uVar9 = uVar1;
            }
            if (iVar10 == 1) {
              *piRead = 0;
              local_8c = 0xb;
              sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10c55,
                          "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
            }
            else {
              uVar13 = uVar13 + 1 & 0x1fff;
            }
            iVar10 = iVar10 + -1;
            iVar8 = local_8c;
          } while (iVar10 != 0);
        }
        local_8c = iVar8;
        cVar7 = '\x01';
LAB_00138246:
        if (cVar7 != '\0') {
          if (cVar7 != '\x02') goto LAB_0013828f;
          break;
        }
        uVar11 = (ulong)(iHash - 1);
      } while (iVar12 < iHash);
    }
  }
  *piRead = uVar9;
  local_8c = 0;
LAB_0013828f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_8c;
}

Assistant:

static int walFindFrame(
  Wal *pWal,                      /* WAL handle */
  Pgno pgno,                      /* Database page number to read data for */
  u32 *piRead                     /* OUT: Frame number (or zero) */
){
  u32 iRead = 0;                  /* If !=0, WAL frame to return data from */
  u32 iLast = pWal->hdr.mxFrame;  /* Last page in WAL for this reader */
  int iHash;                      /* Used to loop through N hash tables */
  int iMinHash;

  /* This routine is only be called from within a read transaction. */
  assert( pWal->readLock>=0 || pWal->lockError );

  /* If the "last page" field of the wal-index header snapshot is 0, then
  ** no data will be read from the wal under any circumstances. Return early
  ** in this case as an optimization.  Likewise, if pWal->readLock==0,
  ** then the WAL is ignored by the reader so return early, as if the
  ** WAL were empty.
  */
  if( iLast==0 || (pWal->readLock==0 && pWal->bShmUnreliable==0) ){
    *piRead = 0;
    return SQLITE_OK;
  }

  /* Search the hash table or tables for an entry matching page number
  ** pgno. Each iteration of the following for() loop searches one
  ** hash table (each hash table indexes up to HASHTABLE_NPAGE frames).
  **
  ** This code might run concurrently to the code in walIndexAppend()
  ** that adds entries to the wal-index (and possibly to this hash
  ** table). This means the value just read from the hash
  ** slot (aHash[iKey]) may have been added before or after the
  ** current read transaction was opened. Values added after the
  ** read transaction was opened may have been written incorrectly -
  ** i.e. these slots may contain garbage data. However, we assume
  ** that any slots written before the current read transaction was
  ** opened remain unmodified.
  **
  ** For the reasons above, the if(...) condition featured in the inner
  ** loop of the following block is more stringent that would be required
  ** if we had exclusive access to the hash-table:
  **
  **   (aPgno[iFrame]==pgno):
  **     This condition filters out normal hash-table collisions.
  **
  **   (iFrame<=iLast):
  **     This condition filters out entries that were added to the hash
  **     table after the current read-transaction had started.
  */
  iMinHash = walFramePage(pWal->minFrame);
  for(iHash=walFramePage(iLast); iHash>=iMinHash; iHash--){
    WalHashLoc sLoc;              /* Hash table location */
    int iKey;                     /* Hash slot index */
    int nCollide;                 /* Number of hash collisions remaining */
    int rc;                       /* Error code */
    u32 iH;

    rc = walHashGet(pWal, iHash, &sLoc);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    nCollide = HASHTABLE_NSLOT;
    iKey = walHash(pgno);
    SEH_INJECT_FAULT;
    while( (iH = AtomicLoad(&sLoc.aHash[iKey]))!=0 ){
      u32 iFrame = iH + sLoc.iZero;
      if( iFrame<=iLast && iFrame>=pWal->minFrame && sLoc.aPgno[iH-1]==pgno ){
        assert( iFrame>iRead || CORRUPT_DB );
        iRead = iFrame;
      }
      if( (nCollide--)==0 ){
        *piRead = 0;
        return SQLITE_CORRUPT_BKPT;
      }
      iKey = walNextHash(iKey);
    }
    if( iRead ) break;
  }

#ifdef SQLITE_ENABLE_EXPENSIVE_ASSERT
  /* If expensive assert() statements are available, do a linear search
  ** of the wal-index file content. Make sure the results agree with the
  ** result obtained using the hash indexes above.  */
  {
    u32 iRead2 = 0;
    u32 iTest;
    assert( pWal->bShmUnreliable || pWal->minFrame>0 );
    for(iTest=iLast; iTest>=pWal->minFrame && iTest>0; iTest--){
      if( walFramePgno(pWal, iTest)==pgno ){
        iRead2 = iTest;
        break;
      }
    }
    assert( iRead==iRead2 );
  }
#endif

  *piRead = iRead;
  return SQLITE_OK;
}